

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::OutputHelper<google::protobuf::internal::ArrayOutput,_4>::Serialize
               (void *ptr,ArrayOutput *output)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  ulong uVar4;
  ulong uVar5;
  
  pbVar2 = output->ptr;
  uVar4 = *ptr;
  if (uVar4 < 0x80) {
    *pbVar2 = (byte)uVar4;
    pbVar2 = pbVar2 + 1;
  }
  else {
    *pbVar2 = (byte)uVar4 | 0x80;
    if (uVar4 < 0x4000) {
      pbVar2[1] = (byte)(uVar4 >> 7);
      pbVar2 = pbVar2 + 2;
    }
    else {
      pbVar2 = pbVar2 + 2;
      uVar4 = uVar4 >> 7;
      do {
        pbVar3 = pbVar2;
        pbVar3[-1] = (byte)uVar4 | 0x80;
        uVar5 = uVar4 >> 7;
        pbVar2 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar4;
        uVar4 = uVar5;
      } while (bVar1);
      *pbVar3 = (byte)uVar5;
    }
  }
  output->ptr = pbVar2;
  return;
}

Assistant:

static void Serialize(const void* ptr, ArrayOutput* output) {
    output->ptr = PrimitiveTypeHelper<type>::SerializeToArray(ptr, output->ptr);
  }